

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::printCounts(ConsoleReporter *this,string *label,Counts *counts)

{
  size_t sVar1;
  ostream *poVar2;
  Counts *counts_local;
  string *label_local;
  ConsoleReporter *this_local;
  
  sVar1 = Counts::total(counts);
  if (sVar1 == 1) {
    poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,"1 ");
    poVar2 = std::operator<<(poVar2,(string *)label);
    std::operator<<(poVar2," - ");
    if (counts->failed == 0) {
      std::operator<<((this->super_StreamingReporterBase).stream,"passed");
    }
    else {
      std::operator<<((this->super_StreamingReporterBase).stream,"failed");
    }
  }
  else {
    poVar2 = (this->super_StreamingReporterBase).stream;
    sVar1 = Counts::total(counts);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar1);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,(string *)label);
    std::operator<<(poVar2,"s ");
    if (counts->passed == 0) {
      if (counts->failed == 2) {
        std::operator<<((this->super_StreamingReporterBase).stream,"- both failed");
      }
      else {
        std::operator<<((this->super_StreamingReporterBase).stream,"- all failed");
      }
    }
    else if (counts->failed == 0) {
      if (counts->passed == 2) {
        std::operator<<((this->super_StreamingReporterBase).stream,"- both passed");
      }
      else {
        std::operator<<((this->super_StreamingReporterBase).stream,"- all passed");
      }
    }
    else {
      poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,"- ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,counts->failed);
      std::operator<<(poVar2," failed");
    }
  }
  return;
}

Assistant:

void printCounts( std::string const& label, Counts const& counts ) {
            if( counts.total() == 1 ) {
                stream << "1 " << label << " - ";
                if( counts.failed )
                    stream << "failed";
                else
                    stream << "passed";
            }
            else {
                stream << counts.total() << " " << label << "s ";
                if( counts.passed ) {
                    if( counts.failed )
                        stream << "- " << counts.failed << " failed";
                    else if( counts.passed == 2 )
                        stream << "- both passed";
                    else
                        stream << "- all passed";
                }
                else {
                    if( counts.failed == 2 )
                        stream << "- both failed";
                    else
                        stream << "- all failed";
                }
            }
        }